

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printToFile(queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *cl)

{
  int iVar1;
  value_type pNVar2;
  bool bVar3;
  ostream *poVar4;
  reference ppNVar5;
  vector<int,_std::allocator<int>_> *this;
  reference piVar6;
  iterator iStack_260;
  int i_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  iterator iStack_240;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int local_220;
  int count;
  int nodeCount;
  ostream local_210 [8];
  ofstream Nodes;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *cl_local;
  
  std::ofstream::ofstream(local_210);
  std::ofstream::open(local_210,"Nodes.txt",0x10);
  std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::pop(cl);
  local_220 = 1;
  while( true ) {
    bVar3 = std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::empty(cl);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    __range2._4_4_ = 0;
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_210,"Node number: ");
    std::ostream::operator<<(poVar4,local_220);
    ppNVar5 = std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::front(cl);
    pNVar2 = *ppNVar5;
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pNVar2->puzzle);
    iStack_240 = std::vector<int,_std::allocator<int>_>::end(&pNVar2->puzzle);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffdc0);
      if (!bVar3) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar1 = *piVar6;
      if (__range2._4_4_ % 3 == 0) {
        std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
      }
      poVar4 = (ostream *)std::ostream::operator<<(local_210,iVar1);
      std::operator<<(poVar4,' ');
      __range2._4_4_ = __range2._4_4_ + 1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    std::operator<<(local_210,"Parent: ");
    ppNVar5 = std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::front(cl);
    this = &(*ppNVar5)->parent->puzzle;
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin(this);
    iStack_260 = std::vector<int,_std::allocator<int>_>::end(this);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffda0);
      if (!bVar3) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      iVar1 = *piVar6;
      if (__range2._4_4_ % 3 == 0) {
        std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
      }
      poVar4 = (ostream *)std::ostream::operator<<(local_210,iVar1);
      std::operator<<(poVar4,' ');
      __range2._4_4_ = __range2._4_4_ + 1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::pop(cl);
    local_220 = local_220 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void printToFile(std::queue<Node*> cl) {
  ofstream Nodes;
  Nodes.open("Nodes.txt");
  cl.pop();
  int nodeCount = 1;
  while (!cl.empty()) {
    int count = 0;
    Nodes << std::endl;
    Nodes << "Node number: " << nodeCount;
    for (auto i : cl.front()->puzzle) {
      if (count % 3 == 0)
        Nodes << std::endl;
      Nodes << i << ' ';
      count++;
    }
    Nodes << std::endl;
    Nodes << "Parent: ";
    for (auto i : cl.front()->parent->puzzle) {
      if (count % 3 == 0)
        Nodes << std::endl;
      Nodes << i << ' ';
      count++;
    }
    cl.pop();
    nodeCount++;
  }
  Nodes.close();
  }